

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void __thiscall Stack1_advanced_Except_Test::TestBody(Stack1_advanced_Except_Test *this)

{
  bool bVar1;
  char *message;
  char *in_R9;
  string local_c0;
  AssertHelper local_a0;
  Message local_98;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  exception *e;
  SimpleStack<int> local_20;
  SimpleStack<int> s;
  bool flag;
  Stack1_advanced_Except_Test *this_local;
  
  s.top._7_1_ = 0;
  SimpleStack<int>::SimpleStack(&local_20);
  SimpleStack<int>::head(&local_20);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_90,(bool *)((long)&s.top + 7),(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c0,(internal *)local_90,(AssertionResult *)"flag","false","true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/NickTikhomirov[P]AYA3_5/tests/test.cpp"
               ,0x4b,message);
    testing::internal::AssertHelper::operator=(&local_a0,&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  SimpleStack<int>::~SimpleStack(&local_20);
  return;
}

Assistant:

TEST(Stack1_advanced, Except) {
	bool flag = false;
	SimpleStack<int> s;
	try {
		s.head();
	}
	catch (std::exception &e) {
		EXPECT_EQ(std::string(e.what()), "The stack is empty!");
		flag = true;
	}
	EXPECT_TRUE(flag);
}